

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O1

void __thiscall
webrtc::AudioProcessingImpl::ApmPublicSubmodules::~ApmPublicSubmodules(ApmPublicSubmodules *this)

{
  IntelligibilityEnhancer *pIVar1;
  GainControlForExperimentalAgc *pGVar2;
  VoiceDetectionImpl *pVVar3;
  NoiseSuppressionImpl *pNVar4;
  LevelEstimatorImpl *pLVar5;
  HighPassFilterImpl *pHVar6;
  GainControlImpl *pGVar7;
  EchoControlMobileImpl *pEVar8;
  _Head_base<0UL,_webrtc::EchoCancellationImpl_*,_false> _Var9;
  pointer *__ptr;
  
  pIVar1 = (this->intelligibility_enhancer)._M_t.
           super___uniq_ptr_impl<webrtc::IntelligibilityEnhancer,_std::default_delete<webrtc::IntelligibilityEnhancer>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::IntelligibilityEnhancer_*,_std::default_delete<webrtc::IntelligibilityEnhancer>_>
           .super__Head_base<0UL,_webrtc::IntelligibilityEnhancer_*,_false>._M_head_impl;
  if (pIVar1 != (IntelligibilityEnhancer *)0x0) {
    (*(pIVar1->super_Callback)._vptr_Callback[1])();
  }
  (this->intelligibility_enhancer)._M_t.
  super___uniq_ptr_impl<webrtc::IntelligibilityEnhancer,_std::default_delete<webrtc::IntelligibilityEnhancer>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::IntelligibilityEnhancer_*,_std::default_delete<webrtc::IntelligibilityEnhancer>_>
  .super__Head_base<0UL,_webrtc::IntelligibilityEnhancer_*,_false>._M_head_impl =
       (IntelligibilityEnhancer *)0x0;
  std::unique_ptr<webrtc::TransientSuppressor,_std::default_delete<webrtc::TransientSuppressor>_>::
  ~unique_ptr(&this->transient_suppressor);
  pGVar2 = (this->gain_control_for_experimental_agc)._M_t.
           super___uniq_ptr_impl<webrtc::GainControlForExperimentalAgc,_std::default_delete<webrtc::GainControlForExperimentalAgc>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::GainControlForExperimentalAgc_*,_std::default_delete<webrtc::GainControlForExperimentalAgc>_>
           .super__Head_base<0UL,_webrtc::GainControlForExperimentalAgc_*,_false>._M_head_impl;
  if (pGVar2 != (GainControlForExperimentalAgc *)0x0) {
    (*(pGVar2->super_GainControl)._vptr_GainControl[0x11])();
  }
  (this->gain_control_for_experimental_agc)._M_t.
  super___uniq_ptr_impl<webrtc::GainControlForExperimentalAgc,_std::default_delete<webrtc::GainControlForExperimentalAgc>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::GainControlForExperimentalAgc_*,_std::default_delete<webrtc::GainControlForExperimentalAgc>_>
  .super__Head_base<0UL,_webrtc::GainControlForExperimentalAgc_*,_false>._M_head_impl =
       (GainControlForExperimentalAgc *)0x0;
  pVVar3 = (this->voice_detection)._M_t.
           super___uniq_ptr_impl<webrtc::VoiceDetectionImpl,_std::default_delete<webrtc::VoiceDetectionImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::VoiceDetectionImpl_*,_std::default_delete<webrtc::VoiceDetectionImpl>_>
           .super__Head_base<0UL,_webrtc::VoiceDetectionImpl_*,_false>._M_head_impl;
  if (pVVar3 != (VoiceDetectionImpl *)0x0) {
    (*(pVVar3->super_VoiceDetection)._vptr_VoiceDetection[9])();
  }
  (this->voice_detection)._M_t.
  super___uniq_ptr_impl<webrtc::VoiceDetectionImpl,_std::default_delete<webrtc::VoiceDetectionImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::VoiceDetectionImpl_*,_std::default_delete<webrtc::VoiceDetectionImpl>_>
  .super__Head_base<0UL,_webrtc::VoiceDetectionImpl_*,_false>._M_head_impl =
       (VoiceDetectionImpl *)0x0;
  pNVar4 = (this->noise_suppression)._M_t.
           super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl,_std::default_delete<webrtc::NoiseSuppressionImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::NoiseSuppressionImpl_*,_std::default_delete<webrtc::NoiseSuppressionImpl>_>
           .super__Head_base<0UL,_webrtc::NoiseSuppressionImpl_*,_false>._M_head_impl;
  if (pNVar4 != (NoiseSuppressionImpl *)0x0) {
    (*(pNVar4->super_NoiseSuppression)._vptr_NoiseSuppression[7])();
  }
  (this->noise_suppression)._M_t.
  super___uniq_ptr_impl<webrtc::NoiseSuppressionImpl,_std::default_delete<webrtc::NoiseSuppressionImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::NoiseSuppressionImpl_*,_std::default_delete<webrtc::NoiseSuppressionImpl>_>
  .super__Head_base<0UL,_webrtc::NoiseSuppressionImpl_*,_false>._M_head_impl =
       (NoiseSuppressionImpl *)0x0;
  pLVar5 = (this->level_estimator)._M_t.
           super___uniq_ptr_impl<webrtc::LevelEstimatorImpl,_std::default_delete<webrtc::LevelEstimatorImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::LevelEstimatorImpl_*,_std::default_delete<webrtc::LevelEstimatorImpl>_>
           .super__Head_base<0UL,_webrtc::LevelEstimatorImpl_*,_false>._M_head_impl;
  if (pLVar5 != (LevelEstimatorImpl *)0x0) {
    (*(pLVar5->super_LevelEstimator)._vptr_LevelEstimator[4])();
  }
  (this->level_estimator)._M_t.
  super___uniq_ptr_impl<webrtc::LevelEstimatorImpl,_std::default_delete<webrtc::LevelEstimatorImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::LevelEstimatorImpl_*,_std::default_delete<webrtc::LevelEstimatorImpl>_>
  .super__Head_base<0UL,_webrtc::LevelEstimatorImpl_*,_false>._M_head_impl =
       (LevelEstimatorImpl *)0x0;
  pHVar6 = (this->high_pass_filter)._M_t.
           super___uniq_ptr_impl<webrtc::HighPassFilterImpl,_std::default_delete<webrtc::HighPassFilterImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::HighPassFilterImpl_*,_std::default_delete<webrtc::HighPassFilterImpl>_>
           .super__Head_base<0UL,_webrtc::HighPassFilterImpl_*,_false>._M_head_impl;
  if (pHVar6 != (HighPassFilterImpl *)0x0) {
    (*(pHVar6->super_HighPassFilter)._vptr_HighPassFilter[3])();
  }
  (this->high_pass_filter)._M_t.
  super___uniq_ptr_impl<webrtc::HighPassFilterImpl,_std::default_delete<webrtc::HighPassFilterImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::HighPassFilterImpl_*,_std::default_delete<webrtc::HighPassFilterImpl>_>
  .super__Head_base<0UL,_webrtc::HighPassFilterImpl_*,_false>._M_head_impl =
       (HighPassFilterImpl *)0x0;
  pGVar7 = (this->gain_control)._M_t.
           super___uniq_ptr_impl<webrtc::GainControlImpl,_std::default_delete<webrtc::GainControlImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::GainControlImpl_*,_std::default_delete<webrtc::GainControlImpl>_>
           .super__Head_base<0UL,_webrtc::GainControlImpl_*,_false>._M_head_impl;
  if (pGVar7 != (GainControlImpl *)0x0) {
    (*(pGVar7->super_GainControl)._vptr_GainControl[0x11])();
  }
  (this->gain_control)._M_t.
  super___uniq_ptr_impl<webrtc::GainControlImpl,_std::default_delete<webrtc::GainControlImpl>_>._M_t
  .super__Tuple_impl<0UL,_webrtc::GainControlImpl_*,_std::default_delete<webrtc::GainControlImpl>_>.
  super__Head_base<0UL,_webrtc::GainControlImpl_*,_false>._M_head_impl = (GainControlImpl *)0x0;
  pEVar8 = (this->echo_control_mobile)._M_t.
           super___uniq_ptr_impl<webrtc::EchoControlMobileImpl,_std::default_delete<webrtc::EchoControlMobileImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl_*,_std::default_delete<webrtc::EchoControlMobileImpl>_>
           .super__Head_base<0UL,_webrtc::EchoControlMobileImpl_*,_false>._M_head_impl;
  if (pEVar8 != (EchoControlMobileImpl *)0x0) {
    (*(pEVar8->super_EchoControlMobile)._vptr_EchoControlMobile[9])();
  }
  (this->echo_control_mobile)._M_t.
  super___uniq_ptr_impl<webrtc::EchoControlMobileImpl,_std::default_delete<webrtc::EchoControlMobileImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::EchoControlMobileImpl_*,_std::default_delete<webrtc::EchoControlMobileImpl>_>
  .super__Head_base<0UL,_webrtc::EchoControlMobileImpl_*,_false>._M_head_impl =
       (EchoControlMobileImpl *)0x0;
  _Var9._M_head_impl =
       (this->echo_cancellation)._M_t.
       super___uniq_ptr_impl<webrtc::EchoCancellationImpl,_std::default_delete<webrtc::EchoCancellationImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_webrtc::EchoCancellationImpl_*,_std::default_delete<webrtc::EchoCancellationImpl>_>
       .super__Head_base<0UL,_webrtc::EchoCancellationImpl_*,_false>._M_head_impl;
  if (_Var9._M_head_impl != (EchoCancellationImpl *)0x0) {
    (**(code **)(*(long *)&(_Var9._M_head_impl)->super_EchoCancellation + 0x90))();
  }
  (this->echo_cancellation)._M_t.
  super___uniq_ptr_impl<webrtc::EchoCancellationImpl,_std::default_delete<webrtc::EchoCancellationImpl>_>
  ._M_t.
  super__Tuple_impl<0UL,_webrtc::EchoCancellationImpl_*,_std::default_delete<webrtc::EchoCancellationImpl>_>
  .super__Head_base<0UL,_webrtc::EchoCancellationImpl_*,_false>._M_head_impl =
       (EchoCancellationImpl *)0x0;
  return;
}

Assistant:

ApmPublicSubmodules() {}